

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O1

void FIX::HttpServer::stopGlobal(void)

{
  thread_id thread;
  undefined4 uVar1;
  long *plVar2;
  
  Mutex::lock((Mutex *)s_mutex);
  plVar2 = s_pServer;
  s_count = s_count + -1;
  if (s_pServer != (long *)0x0 && s_count == 0) {
    if (*(char *)((long)s_pServer + 0xac) == '\0') {
      *(undefined1 *)((long)s_pServer + 0xac) = 1;
      thread = plVar2[0x14];
      if (thread != 0) {
        thread_join(thread);
      }
      plVar2[0x14] = 0;
    }
    if (s_pServer != (long *)0x0) {
      (**(code **)(*s_pServer + 8))();
    }
    s_pServer = (long *)0x0;
  }
  uVar1 = s_mutex._48_4_;
  s_mutex._48_4_ = s_mutex._48_4_ + -1;
  if (1 < (int)uVar1) {
    return;
  }
  s_mutex._40_8_ = 0;
  pthread_mutex_unlock((pthread_mutex_t *)s_mutex);
  return;
}

Assistant:

void HttpServer::stop()
{
  if( m_stop ) return;
  m_stop = true;
  onStop();

  if( m_threadid )
    thread_join( m_threadid );
  m_threadid = 0;
}